

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS
ref_cavity_find_face_with_side
          (REF_CAVITY ref_cavity,REF_INT node0,REF_INT node1,REF_INT *found_face)

{
  int iVar1;
  REF_DBL *pRVar2;
  REF_STATUS in_EAX;
  uint uVar3;
  long lVar5;
  int *piVar4;
  
  *found_face = -1;
  if (0 < ref_cavity->maxface) {
    piVar4 = ref_cavity->f2n + 2;
    lVar5 = 0;
    do {
      iVar1 = piVar4[-2];
      if ((iVar1 != -1) &&
         ((((iVar1 == node0 && (piVar4[-1] == node1)) ||
           ((piVar4[-1] == node0 && (*piVar4 == node1)))) ||
          ((iVar1 == node1 && (*piVar4 == node0)))))) {
        if (*found_face != -1) {
          if (ref_cavity->debug != 0) {
            pRVar2 = ref_cavity->ref_grid->node->real;
            lVar5 = (long)(node0 * 0xf);
            printf("at node0 %f %f %f\n",pRVar2[lVar5],pRVar2[lVar5 + 1],pRVar2[lVar5 + 2]);
            pRVar2 = ref_cavity->ref_grid->node->real;
            lVar5 = (long)(node1 * 0xf);
            uVar3 = printf("at node1 %f %f %f\n",pRVar2[lVar5],pRVar2[lVar5 + 1],pRVar2[lVar5 + 2]);
            piVar4 = (int *)(ulong)uVar3;
          }
          ref_cavity->state = REF_CAVITY_INCONSISTENT;
          *found_face = -1;
          break;
        }
        *found_face = (REF_INT)lVar5;
      }
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + 3;
    } while (lVar5 < ref_cavity->maxface);
    in_EAX = (REF_STATUS)piVar4;
  }
  return in_EAX;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_find_face_with_side(REF_CAVITY ref_cavity,
                                                         REF_INT node0,
                                                         REF_INT node1,
                                                         REF_INT *found_face) {
  REF_INT face;

  *found_face = REF_EMPTY;

  each_ref_cavity_valid_face(ref_cavity, face) {
    if ((node0 == ref_cavity_f2n(ref_cavity, 0, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 1, face)) ||
        (node0 == ref_cavity_f2n(ref_cavity, 1, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (node0 == ref_cavity_f2n(ref_cavity, 2, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 0, face))) {
      if (REF_EMPTY != *found_face) { /* found face twice */
        if (ref_cavity_debug(ref_cavity)) {
          printf("at node0 %f %f %f\n",
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                              node0),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                              node0),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                              node0));
          printf("at node1 %f %f %f\n",
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                              node1),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                              node1),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                              node1));
        }
        ref_cavity_state(ref_cavity) = REF_CAVITY_INCONSISTENT;
        *found_face = REF_EMPTY;
        return REF_SUCCESS;
      }
      *found_face = face;
    }
  }

  return REF_SUCCESS;
}